

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_properties.cpp
# Opt level: O2

void Handler_weaponslot_ISsssssssssssssssssssssssssssssssssssssssssss_PlayerPawn
               (APlayerPawn *defaults,PClassActor *info,Baggage *bag,FPropParam *params)

{
  uint uVar1;
  char *tail;
  bool bVar2;
  FString *this;
  long lVar3;
  FString weapons;
  
  uVar1 = params[1].i;
  bVar2 = DObject::IsKindOf((DObject *)info,PClassPlayerPawn::RegistrationInfo.MyClass);
  if (!bVar2) {
    __assert_fail("info->IsKindOf(RUNTIME_CLASS(PClassPlayerPawn))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/thingdef_properties.cpp"
                  ,0xb93,
                  "void Handler_weaponslot_ISsssssssssssssssssssssssssssssssssssssssssss_PlayerPawn(APlayerPawn *, PClassActor *, Baggage &, FPropParam *)"
                 );
  }
  if (9 < uVar1) {
    I_Error("Slot must be between 0 and 9.");
    return;
  }
  FString::NullString.RefCount = FString::NullString.RefCount + 1;
  weapons.Chars = FString::NullString.Nothing;
  for (lVar3 = 1; lVar3 < params->i; lVar3 = lVar3 + 1) {
    tail = params[lVar3 + 1].s;
    this = FString::operator+=(&weapons,' ');
    FString::operator+=(this,tail);
  }
  FString::operator=((FString *)
                     ((long)&info[1].super_PClass.super_PNativeStruct.super_PStruct.super_PNamedType
                             .super_PCompoundType.super_PType.super_PTypeBase +
                     (ulong)uVar1 * 8 + 0x20),weapons.Chars + 1);
  FString::~FString(&weapons);
  return;
}

Assistant:

DEFINE_CLASS_PROPERTY_PREFIX(player, weaponslot, ISsssssssssssssssssssssssssssssssssssssssssss, PlayerPawn)
{
	PROP_INT_PARM(slot, 0);

	assert(info->IsKindOf(RUNTIME_CLASS(PClassPlayerPawn)));
	if (slot < 0 || slot > 9)
	{
		I_Error("Slot must be between 0 and 9.");
	}
	else
	{
		FString weapons;

		for(int i = 1; i < PROP_PARM_COUNT; ++i)
		{
			PROP_STRING_PARM(str, i);
			weapons << ' ' << str;
		}
		static_cast<PClassPlayerPawn *>(info)->Slot[slot] = &weapons[1];
	}
}